

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexedBWT.h
# Opt level: O0

vector<bool,_std::allocator<bool>_> * __thiscall
bwtil::IndexedBWT::markPositions(IndexedBWT *this,bool verbose)

{
  ostream *poVar1;
  byte in_DL;
  long in_RSI;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  reference rVar2;
  uint last_perc;
  uint perc;
  ulint j;
  ulint i;
  vector<bool,_std::allocator<bool>_> *marked_pos_vec;
  size_type in_stack_ffffffffffffff38;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff40;
  allocator_type *in_stack_ffffffffffffff48;
  IndexedBWT *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff60;
  reference local_60;
  reference local_50;
  uint local_40;
  uint local_3c;
  IndexedBWT *local_38;
  ulong local_30;
  undefined1 local_13;
  undefined1 local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_12 = 0;
  local_13 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x161ff7);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(bool *)in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  std::allocator<bool>::~allocator((allocator<bool> *)0x162022);
  local_30 = *(long *)(in_RSI + 8) - 1;
  local_38 = (IndexedBWT *)0x0;
  local_40 = 1;
  if ((local_11 & 1) != 0) {
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  }
  for (; local_30 != 0; local_30 = local_30 - 1) {
    local_3c = (uint)(((*(long *)(in_RSI + 8) - local_30) * 100) / *(ulong *)(in_RSI + 8));
    if ((((local_11 & 1) != 0) && (local_3c % 10 == 0)) && (local_3c != local_40)) {
      poVar1 = std::operator<<((ostream *)&std::cout,"   ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_3c);
      std::operator<<(poVar1,"% done.\n");
      local_40 = local_3c;
    }
    if (local_30 % *(ulong *)(in_RSI + 0x18) == 0) {
      rVar2 = std::vector<bool,_std::allocator<bool>_>::at
                        (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      local_50 = rVar2;
      std::_Bit_reference::operator=(&local_50,true);
    }
    in_stack_ffffffffffffff50 =
         (IndexedBWT *)LF(in_stack_ffffffffffffff50,(ulint)in_stack_ffffffffffffff48);
    local_38 = in_stack_ffffffffffffff50;
  }
  local_60 = std::vector<bool,_std::allocator<bool>_>::at
                       (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::_Bit_reference::operator=(&local_60,true);
  return in_RDI;
}

Assistant:

vector<bool> markPositions(bool verbose){//mark 1 every offrate positions of the text on the bwt (vector marked_positions)

		auto marked_pos_vec = vector<bool>(n,false);

		ulint i=n-1;//current position on text
		ulint j=0;  //current position on the BWT (0=terminator position on the F column)
		uint perc;
		uint last_perc=1;

		if(verbose) cout << endl;

		while(i>0){

			perc = (100*(n-i))/n;

			if(verbose)
				if(perc%10==0 and perc!= last_perc){

					cout << "   " << perc << "% done.\n";
					last_perc=perc;

				}

			if(i%offrate==0)
				marked_pos_vec.at(j)=true;

			j = LF(j);

			i--;

		}

		//i=0
		marked_pos_vec.at(j)=true;
		//marked_positions.setBit(j,1);
		//marked_positions.computeRanks();

		return marked_pos_vec;

	}